

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug_info_manager.cpp
# Opt level: O1

void __thiscall
spvtools::opt::analysis::DebugInfoManager::RegisterDbgDeclare
          (DebugInfoManager *this,uint32_t var_id,Instruction *dbg_declare)

{
  ulong uVar1;
  CommonDebugInfoInstructions CVar2;
  _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
  *this_00;
  ulong uVar3;
  _Hash_node_base *p_Var4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  uint32_t local_24;
  Instruction *local_20;
  Instruction *local_18;
  
  local_24 = var_id;
  local_20 = dbg_declare;
  CVar2 = Instruction::GetCommonDebugOpcode(dbg_declare);
  if ((CVar2 != CommonDebugInfoDebugDeclare) &&
     (CVar2 = Instruction::GetCommonDebugOpcode(local_20), CVar2 != CommonDebugInfoDebugValue)) {
    __assert_fail("dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare || dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugValue"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/debug_info_manager.cpp"
                  ,0x8d,
                  "void spvtools::opt::analysis::DebugInfoManager::RegisterDbgDeclare(uint32_t, Instruction *)"
                 );
  }
  uVar1 = (this->var_id_to_dbg_decl_)._M_h._M_bucket_count;
  uVar3 = (ulong)local_24 % uVar1;
  p_Var5 = (this->var_id_to_dbg_decl_)._M_h._M_buckets[uVar3];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var4 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_24 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var4, p_Var4 = p_Var5->_M_nxt, p_Var4 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var4[1]._M_nxt % uVar1 != uVar3) ||
         (p_Var6 = p_Var5, local_24 == *(uint *)&p_Var4[1]._M_nxt)) goto LAB_0055d5c7;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_0055d5c7:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var4 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var4 = p_Var6->_M_nxt;
  }
  if (p_Var4 == (_Hash_node_base *)0x0) {
    local_18 = local_20;
    this_00 = (_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
               *)std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::opt::Instruction_*,_spvtools::opt::analysis::DebugInfoManager::InstPtrLess,_std::allocator<spvtools::opt::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&this->var_id_to_dbg_decl_,&local_24);
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
    ::_M_assign_unique<spvtools::opt::Instruction*const*>
              (this_00,&local_18,(Instruction **)&stack0xfffffffffffffff0);
  }
  else {
    std::
    _Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
    ::_M_insert_unique<spvtools::opt::Instruction*const&>
              ((_Rb_tree<spvtools::opt::Instruction*,spvtools::opt::Instruction*,std::_Identity<spvtools::opt::Instruction*>,spvtools::opt::analysis::DebugInfoManager::InstPtrLess,std::allocator<spvtools::opt::Instruction*>>
                *)(p_Var4 + 2),&local_20);
  }
  return;
}

Assistant:

void DebugInfoManager::RegisterDbgDeclare(uint32_t var_id,
                                          Instruction* dbg_declare) {
  assert(dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugDeclare ||
         dbg_declare->GetCommonDebugOpcode() == CommonDebugInfoDebugValue);
  auto dbg_decl_itr = var_id_to_dbg_decl_.find(var_id);
  if (dbg_decl_itr == var_id_to_dbg_decl_.end()) {
    var_id_to_dbg_decl_[var_id] = {dbg_declare};
  } else {
    dbg_decl_itr->second.insert(dbg_declare);
  }
}